

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlagsT<long_long>(char *label,longlong *flags,longlong flags_value)

{
  ImGuiItemFlags IVar1;
  ImGuiContext_conflict *pIVar2;
  ImGuiItemFlags backup_item_flags;
  ImGuiContext *g;
  bool pressed;
  bool any_on;
  ulong uStack_20;
  bool all_on;
  longlong flags_value_local;
  longlong *flags_local;
  char *label_local;
  
  pIVar2 = GImGui;
  g._7_1_ = (*flags & flags_value) == flags_value;
  g._6_1_ = (*flags & flags_value) != 0;
  uStack_20 = flags_value;
  flags_value_local = (longlong)flags;
  flags_local = (longlong *)label;
  if (((bool)g._7_1_) || (!(bool)g._6_1_)) {
    g._5_1_ = Checkbox(label,(bool *)((long)&g + 7));
  }
  else {
    IVar1 = GImGui->CurrentItemFlags;
    GImGui->CurrentItemFlags = GImGui->CurrentItemFlags | 0x40;
    g._5_1_ = Checkbox(label,(bool *)((long)&g + 7));
    pIVar2->CurrentItemFlags = IVar1;
  }
  if (g._5_1_ != false) {
    if ((g._7_1_ & 1) == 0) {
      *(ulong *)flags_value_local = (uStack_20 ^ 0xffffffffffffffff) & *(ulong *)flags_value_local;
    }
    else {
      *(ulong *)flags_value_local = uStack_20 | *(ulong *)flags_value_local;
    }
  }
  return g._5_1_;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiContext& g = *GImGui;
        ImGuiItemFlags backup_item_flags = g.CurrentItemFlags;
        g.CurrentItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
        g.CurrentItemFlags = backup_item_flags;
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}